

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

Hash __thiscall
Fossilize::StateRecorder::Impl::get_application_link_hash(Impl *this,ResourceTag tag,Hash hash)

{
  Hash HVar1;
  
  HVar1 = Hashing::compute_combined_application_feature_hash(&this->application_feature_hash);
  return (((HVar1 >> 0x20 ^ (HVar1 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3) *
           0x100000001b3 ^ (ulong)tag) * 0x100000001b3 ^ hash & 0xffffffff) * 0x100000001b3 ^
         hash >> 0x20;
}

Assistant:

Hash StateRecorder::Impl::get_application_link_hash(ResourceTag tag, Hash hash) const
{
	return Hashing::compute_hash_application_info_link(application_feature_hash, tag, hash);
}